

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O2

void __thiscall BamTools::ResolveTool::StatsFileWriter::WriteHeader(StatsFileWriter *this)

{
  ostream *poVar1;
  string local_1b0 [32];
  stringstream versionStream;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&versionStream);
  poVar1 = std::operator<<(local_180,'v');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,1);
  poVar1 = std::operator<<((ostream *)this,'#');
  poVar1 = std::operator<<(poVar1," bamtools resolve (");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,local_1b0);
  poVar1 = std::operator<<(poVar1,')');
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,'#');
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,(string *)&MODEL_DESCRIPTION_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&versionStream);
  return;
}

Assistant:

void ResolveTool::StatsFileWriter::WriteHeader()
{

    // stringify current bamtools version
    std::stringstream versionStream;
    versionStream << 'v' << BAMTOOLS_VERSION_MAJOR << '.' << BAMTOOLS_VERSION_MINOR << '.'
                  << BAMTOOLS_VERSION_PATCH;

    // # bamtools resolve (vX.Y.Z)
    // #
    // # MODEL DESCRIPTION - see above for actual text
    // \n

    m_stream << COMMENT_CHAR << " bamtools resolve (" << versionStream.str() << ')' << std::endl
             << COMMENT_CHAR << std::endl
             << MODEL_DESCRIPTION << std::endl;
}